

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall
nigel::Lexer::splitToken
          (Lexer *this,String *identifier,size_t index,iterator *token,
          list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
          *lexerStruct)

{
  size_t sVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *this_01;
  const_iterator local_d8;
  undefined1 local_d0 [48];
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  shared_ptr<nigel::Token> tmp2;
  string local_70 [32];
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  shared_ptr<nigel::Token> tmp1;
  list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
  *lexerStruct_local;
  iterator *token_local;
  size_t index_local;
  String *identifier_local;
  Lexer *this_local;
  
  tmp1.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lexerStruct;
  std::__cxx11::string::substr((ulong)local_70,(ulong)identifier);
  std::make_shared<nigel::Token_Operator,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::shared_ptr<nigel::Token>::shared_ptr<nigel::Token_Operator,void>
            ((shared_ptr<nigel::Token> *)local_40,(shared_ptr<nigel::Token_Operator> *)local_50);
  std::shared_ptr<nigel::Token_Operator>::~shared_ptr((shared_ptr<nigel::Token_Operator> *)local_50)
  ;
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::substr((ulong)(local_d0 + 0x10),(ulong)identifier);
  std::make_shared<nigel::Token_Operator,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::shared_ptr<nigel::Token>::shared_ptr<nigel::Token_Operator,void>
            ((shared_ptr<nigel::Token> *)local_90,(shared_ptr<nigel::Token_Operator> *)local_a0);
  std::shared_ptr<nigel::Token_Operator>::~shared_ptr((shared_ptr<nigel::Token_Operator> *)local_a0)
  ;
  std::__cxx11::string::~string((string *)(local_d0 + 0x10));
  p_Var2 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(token);
  peVar3 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  sVar1 = peVar3->columnNo;
  peVar3 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_40);
  peVar3->columnNo = sVar1;
  p_Var2 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(token);
  peVar3 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  sVar1 = peVar3->lineNo;
  peVar3 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_40);
  peVar3->lineNo = sVar1;
  p_Var2 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(token);
  peVar3 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  peVar4 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_40);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(&peVar4->line,&peVar3->line);
  p_Var2 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(token);
  peVar3 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  peVar4 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_40);
  std::shared_ptr<boost::filesystem::path>::operator=(&peVar4->path,&peVar3->path);
  p_Var2 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(token);
  peVar3 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  sVar1 = peVar3->columnNo;
  peVar3 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_90);
  peVar3->columnNo = sVar1 + index;
  p_Var2 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(token);
  peVar3 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  sVar1 = peVar3->lineNo;
  peVar3 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_90);
  peVar3->lineNo = sVar1;
  p_Var2 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(token);
  peVar3 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  peVar4 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_90);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(&peVar4->line,&peVar3->line);
  p_Var2 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(token);
  peVar3 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  peVar4 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_90);
  std::shared_ptr<boost::filesystem::path>::operator=(&peVar4->path,&peVar3->path);
  std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_40
            );
  Token::as<nigel::Token_Operator>((Token *)local_d0);
  peVar5 = std::
           __shared_ptr_access<const_nigel::Token_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_nigel::Token_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_d0);
  std::__cxx11::string::operator=((string *)identifier,(string *)&peVar5->operatorToken);
  std::shared_ptr<const_nigel::Token_Operator>::~shared_ptr
            ((shared_ptr<const_nigel::Token_Operator> *)local_d0);
  this_00 = tmp1.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::_List_const_iterator<std::shared_ptr<nigel::Token>_>::_List_const_iterator(&local_d8,token);
  std::__cxx11::list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
  ::insert((list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_> *)
           this_00._M_pi,local_d8,(value_type *)local_40);
  this_01 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(token)->
             super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
            (this_01,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)local_90);
  std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator--(token,0);
  std::shared_ptr<nigel::Token>::~shared_ptr((shared_ptr<nigel::Token> *)local_90);
  std::shared_ptr<nigel::Token>::~shared_ptr((shared_ptr<nigel::Token> *)local_40);
  return;
}

Assistant:

void Lexer::splitToken( String &identifier, size_t index, std::list<std::shared_ptr<Token>>::iterator &token, std::list<std::shared_ptr<Token>> &lexerStruct )
	{
		std::shared_ptr<Token> tmp1 = std::make_shared<Token_Operator>( identifier.substr( 0, index ) );
		std::shared_ptr<Token> tmp2 = std::make_shared<Token_Operator>( identifier.substr( index ) );

		tmp1->columnNo = ( *token )->columnNo;
		tmp1->lineNo = ( *token )->lineNo;
		tmp1->line = ( *token )->line;
		tmp1->path = ( *token )->path;
		tmp2->columnNo = ( *token )->columnNo + index;
		tmp2->lineNo = ( *token )->lineNo;
		tmp2->line = ( *token )->line;
		tmp2->path = ( *token )->path;

		identifier = tmp1->as<Token_Operator>()->operatorToken;
		lexerStruct.insert( token, tmp1 );
		token->swap( tmp2 );
		token--;
	}